

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void demmt_munmap(mmt_unmap *mm,void *state)

{
  cpu_mapping *pcVar1;
  
  pcVar1 = get_cpu_mapping(mm->id);
  if (pcVar1 != (cpu_mapping *)0x0) {
    if (dump_sys_munmap != 0) {
      if (indent_logs == 0) {
        fprintf(_stdout,"LOG: munmap: address: 0x%lx, length: 0x%08lx, id: %d, offset: 0x%08lx",
                mm->start,mm->len,(ulong)mm->id,mm->offset);
      }
      else {
        fprintf(_stdout,"%64smunmap: address: 0x%lx, length: 0x%08lx, id: %d, offset: 0x%08lx"," ");
      }
    }
    nvrm_munmap(mm->id,mm->start,mm->len,mm->offset);
    return;
  }
  fprintf(_stdout,"ERROR: invalid buffer id: %d\n",(ulong)mm->id);
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  demmt_abort();
}

Assistant:

static void demmt_munmap(struct mmt_unmap *mm, void *state)
{
	if (get_cpu_mapping(mm->id) == NULL)
	{
		mmt_error("invalid buffer id: %d\n", mm->id);
		demmt_abort();
	}

	if (dump_sys_munmap)
		mmt_log("munmap: address: 0x%" PRIx64 ", length: 0x%08" PRIx64 ", id: %d, offset: 0x%08" PRIx64 "",
				mm->start, mm->len, mm->id, mm->offset);

	nvrm_munmap(mm->id, mm->start, mm->len, mm->offset);
}